

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O2

ObjectPtr __thiscall ICM::DefFunc::BoolCalc::Not::func(Not *this,DataList *list)

{
  DataObject<(ICM::DefaultType)6> *this_00;
  long in_RDX;
  T local_19;
  
  this_00 = (DataObject<(ICM::DefaultType)6> *)operator_new(0x10);
  local_19 = (T)(**(byte **)(**(long **)(in_RDX + 8) + 8) ^ 1);
  Objects::DataObject<(ICM::DefaultType)6>::DataObject(this_00,&local_19);
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)this_00;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					return ObjectPtr(new Boolean(!list[0]->dat<T_Boolean>()));
				}